

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<ImVec4>::push_back(ImVector<ImVec4> *this,ImVec4 *v)

{
  ImVec4 *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  int new_capacity;
  
  iVar6 = this->Size;
  if (iVar6 == this->Capacity) {
    if (iVar6 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar6 / 2 + iVar6;
    }
    new_capacity = iVar6 + 1;
    if (iVar6 + 1 < iVar5) {
      new_capacity = iVar5;
    }
    reserve(this,new_capacity);
    iVar6 = this->Size;
  }
  fVar2 = v->y;
  fVar3 = v->z;
  fVar4 = v->w;
  pIVar1 = this->Data + iVar6;
  pIVar1->x = v->x;
  pIVar1->y = fVar2;
  pIVar1->z = fVar3;
  pIVar1->w = fVar4;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }